

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>::
_encodeArray<unsigned_int>
          (CompositeCodec<FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
           *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  NewPFor<4U,_FastPForLib::Simple16<false>_> *this_00;
  logic_error *this_01;
  VariableByte *this_02;
  NewPFor<4U,_FastPForLib::Simple16<false>_> *in_RDX;
  uint32_t *in_RDI;
  long *in_R8;
  size_t nvalue2;
  size_t nvalue1;
  size_t roundedlength;
  uint32_t *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffb0;
  uint32_t *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  uint32_t *in_00;
  
  if (*in_R8 != 0) {
    this_00 = (NewPFor<4U,_FastPForLib::Simple16<false>_> *)((ulong)in_RDX & 0xffffffffffffff80);
    in_00 = (uint32_t *)*in_R8;
    NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeArray
              (this_00,in_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    if (this_00 < in_RDX) {
      if ((uint32_t *)*in_R8 < in_00) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_01,"Encode run over output buffer. Potential buffer overflow!");
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      this_02 = (VariableByte *)(*in_R8 - (long)in_00);
      VariableByte::encodeArray
                (this_02,in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (size_t *)0x14e31d);
      *in_R8 = (long)in_00 + (long)this_02;
    }
    else {
      *in_R8 = (long)in_00;
    }
  }
  return;
}

Assistant:

void _encodeArray(const IntType *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    if (nvalue == 0) {
      return;
    }
    const size_t roundedlength = length / Codec1::BlockSize * Codec1::BlockSize;
    size_t nvalue1 = nvalue;
    codec1.encodeArray(in, roundedlength, out, nvalue1);

    if (roundedlength < length) {
      if (nvalue1 > nvalue) {
        throw std::logic_error(
            "Encode run over output buffer. Potential buffer overflow!");
      }
      size_t nvalue2 = nvalue - nvalue1;
      codec2.encodeArray(in + roundedlength, length - roundedlength,
                         out + nvalue1, nvalue2);
      nvalue = nvalue1 + nvalue2;
    } else {
      nvalue = nvalue1;
    }
  }